

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_statement.cpp
# Opt level: O1

unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true> __thiscall
duckdb::SelectStatement::Deserialize(SelectStatement *this,Deserializer *deserializer)

{
  int iVar1;
  _func_int **pp_Var2;
  pointer pSVar3;
  byte bVar4;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var5;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_30;
  
  pp_Var2 = (_func_int **)operator_new(0x80);
  *(undefined1 *)(pp_Var2 + 1) = 1;
  pp_Var2[2] = (_func_int *)0x0;
  pp_Var2[3] = (_func_int *)0x0;
  pp_Var2[4] = (_func_int *)(pp_Var2 + 10);
  pp_Var2[5] = (_func_int *)0x1;
  pp_Var2[6] = (_func_int *)0x0;
  pp_Var2[7] = (_func_int *)0x0;
  *(undefined4 *)(pp_Var2 + 8) = 0x3f800000;
  pp_Var2[9] = (_func_int *)0x0;
  pp_Var2[10] = (_func_int *)0x0;
  pp_Var2[0xb] = (_func_int *)(pp_Var2 + 0xd);
  pp_Var2[0xc] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var2 + 0xd) = 0;
  *pp_Var2 = (_func_int *)&PTR__SelectStatement_02486628;
  pp_Var2[0xf] = (_func_int *)0x0;
  (this->super_SQLStatement)._vptr_SQLStatement = pp_Var2;
  pSVar3 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>::
           operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                       *)this);
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,100,"node");
  bVar4 = (byte)iVar1;
  if (bVar4 == 0) {
    _Var5._M_head_impl =
         (pSVar3->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
         ._M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pSVar3->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t
    .super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
    if (_Var5._M_head_impl == (QueryNode *)0x0) {
      bVar4 = 0;
      goto LAB_017806f7;
    }
  }
  else {
    iVar1 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar1 == '\0') {
      local_30._M_head_impl = (QueryNode *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      QueryNode::Deserialize((QueryNode *)&stack0xffffffffffffffd0,deserializer);
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var5._M_head_impl =
         (pSVar3->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
         ._M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pSVar3->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t
    .super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = local_30._M_head_impl;
    if (_Var5._M_head_impl == (QueryNode *)0x0) {
      bVar4 = 1;
      goto LAB_017806f7;
    }
  }
  (*(_Var5._M_head_impl)->_vptr_QueryNode[1])();
LAB_017806f7:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar4);
  pSVar3 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>::
           operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                       *)this);
  Deserializer::
  ReadPropertyWithDefault<std::unordered_map<std::__cxx11::string,unsigned_long,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>>
            (deserializer,0x65,"named_param_map",&(pSVar3->super_SQLStatement).named_param_map);
  return (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>)
         (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>)this;
}

Assistant:

unique_ptr<SelectStatement> SelectStatement::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<SelectStatement>(new SelectStatement());
	deserializer.ReadPropertyWithDefault<unique_ptr<QueryNode>>(100, "node", result->node);
	deserializer.ReadPropertyWithDefault<case_insensitive_map_t<idx_t>>(101, "named_param_map", result->named_param_map);
	return result;
}